

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xboxskin.cpp
# Opt level: O0

ObjPipeline * rw::xbox::makeSkinPipeline(void)

{
  ObjPipeline *pOVar1;
  ObjPipeline *pipe;
  
  pOVar1 = ObjPipeline::create();
  pOVar1->instanceCB = skinInstanceCB;
  pOVar1->uninstanceCB = skinUninstanceCB;
  (pOVar1->super_ObjPipeline).super_Pipeline.pluginID = 0x116;
  (pOVar1->super_ObjPipeline).super_Pipeline.pluginData = 1;
  return pOVar1;
}

Assistant:

ObjPipeline*
makeSkinPipeline(void)
{
	ObjPipeline *pipe = ObjPipeline::create();
	pipe->instanceCB = skinInstanceCB;
	pipe->uninstanceCB = skinUninstanceCB;
	pipe->pluginID = ID_SKIN;
	pipe->pluginData = 1;
	return pipe;
}